

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O2

CborError append_to_buffer(CborEncoder *encoder,void *data,size_t len,
                          CborEncoderAppendType appendType)

{
  CborError CVar1;
  
  CVar1 = CborDevice::callback(encoder->end,data,len,appendType);
  return CVar1;
}

Assistant:

static inline CborError append_to_buffer(CborEncoder *encoder, const void *data, size_t len,
                                         CborEncoderAppendType appendType)
{
    if (CBOR_ENCODER_WRITER_CONTROL >= 0) {
        if (encoder->flags & CborIteratorFlag_WriterFunction || CBOR_ENCODER_WRITER_CONTROL != 0) {
#  ifdef CBOR_ENCODER_WRITE_FUNCTION
            return CBOR_ENCODER_WRITE_FUNCTION(encoder->end, data, len, appendType);
#  else
            return encoder->data.writer(encoder->end, data, len, appendType);
#  endif
        }
    }

#if CBOR_ENCODER_WRITER_CONTROL <= 0
    if (would_overflow(encoder, len)) {
        if (encoder->end != NULL) {
            len -= encoder->end - encoder->data.ptr;
            encoder->end = NULL;
            encoder->data.bytes_needed = 0;
        }

        advance_ptr(encoder, len);
        return CborErrorOutOfMemory;
    }

    memcpy(encoder->data.ptr, data, len);
    encoder->data.ptr += len;
#endif
    return CborNoError;
}